

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorPicker::mousePressEvent(QColorPicker *this,QMouseEvent *m)

{
  long lVar1;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect QVar2;
  QPoint p;
  QWidget *this_00;
  QPointF *in_stack_ffffffffffffffc0;
  QColorPicker *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QSinglePointEvent::position((QSinglePointEvent *)0x733842);
  QPointF::toPoint(in_stack_ffffffffffffffc0);
  QVar2 = QWidget::contentsRect(this_00);
  this_01 = QVar2._0_8_;
  QRect::topLeft((QRect *)in_RDI);
  ::operator-((QPoint *)this_01,(QPoint *)this_00);
  setCol(this_01,(QPoint *)this_00);
  newCol((QColorPicker *)0x7338b0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::mousePressEvent(QMouseEvent *m)
{
    QPoint p = m->position().toPoint() - contentsRect().topLeft();
    setCol(p);
    emit newCol(hue, sat);
}